

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

void __thiscall BuildStatus::PrintStatus(BuildStatus *this,Edge *edge,EdgeStatus status)

{
  ulong uVar1;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string to_print;
  bool force_full_command;
  EdgeStatus status_local;
  Edge *edge_local;
  BuildStatus *this_local;
  
  if (this->config_->verbosity != QUIET) {
    to_print.field_2._M_local_buf[0xb] = this->config_->verbosity == VERBOSE;
    to_print.field_2._12_4_ = status;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"description",&local_61);
    Edge::GetBinding((string *)local_40,edge,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    uVar1 = std::__cxx11::string::empty();
    if (((uVar1 & 1) != 0) || ((to_print.field_2._M_local_buf[0xb] & 1U) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"command",&local_b9);
      Edge::GetBinding(&local_98,edge,&local_b8);
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
    }
    FormatProgressStatus_abi_cxx11_
              (&local_100,this,this->progress_status_format_,to_print.field_2._12_4_);
    std::operator+(&local_e0,&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string((string *)&local_120,(string *)local_40);
    LinePrinter::Print(&this->printer_,&local_120,(byte)~to_print.field_2._M_local_buf[0xb] & ELIDE)
    ;
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void BuildStatus::PrintStatus(const Edge* edge, EdgeStatus status) {
  if (config_.verbosity == BuildConfig::QUIET)
    return;

  bool force_full_command = config_.verbosity == BuildConfig::VERBOSE;

  string to_print = edge->GetBinding("description");
  if (to_print.empty() || force_full_command)
    to_print = edge->GetBinding("command");

  to_print = FormatProgressStatus(progress_status_format_, status) + to_print;

  printer_.Print(to_print,
                 force_full_command ? LinePrinter::FULL : LinePrinter::ELIDE);
}